

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall SQFuncState::GetLocalVariable(SQFuncState *this,SQObject *name)

{
  SQLocalVarInfo *pSVar1;
  SQLocalVarInfo *lvi;
  SQInteger locals;
  SQObject *name_local;
  SQFuncState *this_local;
  
  lvi = (SQLocalVarInfo *)sqvector<SQLocalVarInfo>::size(&this->_vlocals);
  while( true ) {
    if ((long)lvi < 1) {
      return -1;
    }
    pSVar1 = sqvector<SQLocalVarInfo>::operator[]
                       (&this->_vlocals,(SQUnsignedInteger)((long)&lvi[-1]._pos + 7));
    if (((pSVar1->_name).super_SQObject._type == OT_STRING) &&
       ((pSVar1->_name).super_SQObject._unVal.pTable == (name->_unVal).pTable)) break;
    lvi = (SQLocalVarInfo *)((long)&lvi[-1]._pos + 7);
  }
  return (SQInteger)(undefined1 *)((long)&lvi[-1]._pos + 7);
}

Assistant:

SQInteger SQFuncState::GetLocalVariable(const SQObject &name)
{
    SQInteger locals=_vlocals.size();
    while(locals>=1){
        SQLocalVarInfo &lvi = _vlocals[locals-1];
        if(sq_type(lvi._name)==OT_STRING && _string(lvi._name)==_string(name)){
            return locals-1;
        }
        locals--;
    }
    return -1;
}